

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::Address::Set(Error *__return_storage_ptr__,Address *this,string *aIp)

{
  int iVar1;
  char *pcVar2;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  ByteArray bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  string local_b0;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  pointer local_68;
  char *pcStack_60;
  size_t local_58;
  undefined8 local_50;
  format_string_checker<char> *local_48;
  code *local_40;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_c8,4);
  iVar1 = inet_pton(2,(aIp->_M_dataplus)._M_p,
                    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  if (iVar1 != 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_c8,0x10);
    iVar1 = inet_pton(10,(aIp->_M_dataplus)._M_p,
                      local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    if (iVar1 != 1) {
      local_68 = (pointer)CONCAT44(local_68._4_4_,string_type);
      pcStack_60 = "{} is not a valid IP address";
      local_58 = 0x1c;
      local_50._0_4_ = 0;
      local_50._4_4_ = 1;
      local_40 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      begin = "{} is not a valid IP address";
      local_48 = (format_string_checker<char> *)&local_68;
      do {
        pcVar2 = begin + 1;
        if (*begin == '}') {
          if ((pcVar2 == "") || (*pcVar2 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar2 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar2 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (begin,"",(format_string_checker<char> *)&local_68);
        }
        begin = pcVar2;
      } while (pcVar2 != "");
      local_68 = (aIp->_M_dataplus)._M_p;
      pcStack_60 = (char *)aIp->_M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1c;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"{} is not a valid IP address",fmt,args);
      local_90 = kInvalidArgs;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
      __return_storage_ptr__->mCode = local_90;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      goto LAB_001fb70d;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mBytes,&local_c8);
LAB_001fb70d:
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Address::Set(const std::string &aIp)
{
    Error     error;
    ByteArray bytes;

    bytes.resize(kIpv4Size);
    if (inet_pton(AF_INET, aIp.c_str(), bytes.data()) != 1)
    {
        bytes.resize(kIpv6Size);
        if (inet_pton(AF_INET6, aIp.c_str(), bytes.data()) != 1)
        {
            ExitNow(error = ERROR_INVALID_ARGS("{} is not a valid IP address", aIp));
        }
    }

    mBytes = bytes;

exit:
    return error;
}